

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags,
                     ImGuiWindow *docked_window)

{
  float fVar1;
  float fVar2;
  int iVar3;
  ImGuiWindow *this;
  ImGuiDockNode *pIVar4;
  ImDrawList *draw_list;
  ImVec2 IVar5;
  char *pcVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  ImU32 id;
  int iVar9;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar10;
  size_t sVar11;
  char *pcVar12;
  int iVar13;
  ImS8 IVar14;
  ImGuiCol idx;
  uint uVar15;
  uint uVar16;
  ImGuiContext *pIVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  ImGuiTabItem *pIVar21;
  bool bVar22;
  float fVar23;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar24;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  ImVec2 IVar29;
  ImRect bb;
  bool held;
  bool hovered;
  ImRect local_a8;
  ImVec2 local_8c;
  uint local_84;
  ImGuiTabBar *local_80;
  char *local_78;
  ImGuiContext *local_70;
  ImVec2 local_68;
  int local_60;
  int local_5c;
  undefined1 local_58 [8];
  undefined4 uStack_50;
  undefined4 uStack_4c;
  bool *local_40;
  ImGuiTextBuffer *local_38;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  local_70 = GImGui;
  this = GImGui->CurrentWindow;
  if (this->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID((ImGuiTabBar *)(ulong)(uint)tab_bar->Flags,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    PushItemFlag(0x18,true);
    bVar22 = false;
LAB_001943b7:
    local_a8.Max.x = 0.0;
    local_a8.Max.y = 0.0;
    local_a8.Min.x = 0.0;
    local_a8.Min.y = 0.0;
    ItemAdd(&local_a8,id,(ImRect *)0x0);
    PopItemFlag();
    return bVar22;
  }
  local_40 = (bool *)0x0;
  uVar16 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_40 = p_open;
    uVar16 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    uVar16 = flags;
  }
  IVar5 = TabItemCalcSize(label,local_40 != (bool *)0x0);
  pIVar17 = local_70;
  fVar23 = IVar5.x;
  local_a8.Max.y = IVar5.y;
  uVar15 = (tab_bar->Tabs).Size;
  uVar24 = extraout_XMM0_Dc;
  uVar25 = extraout_XMM0_Dd;
  local_78 = label;
  if (0 < (int)uVar15 && id != 0) {
    pIVar10 = (tab_bar->Tabs).Data;
    lVar20 = 0;
    do {
      if (*(ImU32 *)((long)&pIVar10->ID + lVar20) == id) {
        pIVar21 = (ImGuiTabItem *)((long)&pIVar10->ID + lVar20);
        bVar8 = false;
        goto LAB_00194251;
      }
      lVar20 = lVar20 + 0x28;
    } while ((ulong)uVar15 * 0x28 != lVar20);
  }
  if (uVar15 == (tab_bar->Tabs).Capacity) {
    uStack_50 = extraout_XMM0_Dc;
    local_58._0_4_ = IVar5.x;
    local_58._4_4_ = IVar5.y;
    uStack_4c = extraout_XMM0_Dd;
    if (uVar15 == 0) {
      iVar13 = 8;
    }
    else {
      iVar13 = (int)uVar15 / 2 + uVar15;
    }
    iVar19 = uVar15 + 1;
    if ((int)(uVar15 + 1) < iVar13) {
      iVar19 = iVar13;
    }
    pIVar10 = (ImGuiTabItem *)MemAlloc((long)iVar19 * 0x28);
    pIVar21 = (tab_bar->Tabs).Data;
    if (pIVar21 != (ImGuiTabItem *)0x0) {
      memcpy(pIVar10,pIVar21,(long)(tab_bar->Tabs).Size * 0x28);
      MemFree((tab_bar->Tabs).Data);
    }
    (tab_bar->Tabs).Data = pIVar10;
    (tab_bar->Tabs).Capacity = iVar19;
    uVar15 = (tab_bar->Tabs).Size;
    fVar23 = (float)local_58._0_4_;
    local_a8.Max.y = (float)local_58._4_4_;
    uVar24 = uStack_50;
    uVar25 = uStack_4c;
  }
  else {
    pIVar10 = (tab_bar->Tabs).Data;
  }
  pIVar21 = pIVar10 + (int)uVar15;
  pIVar21->ID = 0;
  pIVar21->Flags = 0;
  pIVar21->Window = (ImGuiWindow *)0x0;
  pIVar10[(int)uVar15].LastFrameVisible = -1;
  pIVar10[(int)uVar15].LastFrameSelected = -1;
  pIVar10[(int)uVar15].NameOffset = -1;
  pIVar10[(int)uVar15].Offset = 0.0;
  pIVar10[(int)uVar15].Width = 0.0;
  pIVar10[(int)uVar15].ContentWidth = 0.0;
  iVar13 = (tab_bar->Tabs).Size;
  (tab_bar->Tabs).Size = iVar13 + 1;
  pIVar10 = (tab_bar->Tabs).Data;
  pIVar21 = pIVar10 + iVar13;
  pIVar21->ID = id;
  pIVar10[iVar13].Width = fVar23;
  bVar8 = true;
LAB_00194251:
  pcVar6 = local_78;
  tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar21 - (int)pIVar10) >> 3) * -0x3333;
  pIVar21->ContentWidth = fVar23;
  iVar13 = tab_bar->PrevFrameVisible;
  local_84 = tab_bar->Flags;
  iVar19 = pIVar17->FrameCount;
  iVar18 = pIVar21->LastFrameVisible + 1;
  pIVar21->LastFrameVisible = iVar19;
  pIVar21->Flags = uVar16;
  pIVar21->Window = docked_window;
  if ((local_84 >> 0x14 & 1) == 0) {
    local_38 = &tab_bar->TabsNames;
    iVar3 = (tab_bar->TabsNames).Buf.Size;
    iVar9 = iVar3 + -1;
    if (iVar3 == 0) {
      iVar9 = 0;
    }
    pIVar21->NameOffset = iVar9;
    local_58._4_4_ = local_a8.Max.y;
    local_58._0_4_ = fVar23;
    uStack_50 = uVar24;
    uStack_4c = uVar25;
    local_80 = tab_bar;
    sVar11 = strlen(local_78);
    pIVar17 = local_70;
    ImGuiTextBuffer::append(local_38,pcVar6,pcVar6 + sVar11 + 1);
    tab_bar = local_80;
    local_a8.Max.y = (float)local_58._4_4_;
  }
  else {
    pIVar21->NameOffset = -1;
  }
  iVar13 = iVar13 + 1;
  uVar15 = tab_bar->Flags;
  if (iVar18 < iVar19) {
    if ((((uVar15 & 2) != 0) && (tab_bar->NextSelectedTabId == 0)) &&
       ((iVar19 <= iVar13 || (tab_bar->SelectedTabId == 0)))) {
      tab_bar->NextSelectedTabId = id;
    }
  }
  else if ((uVar15 & 1) == 0) {
    fVar23 = tab_bar->OffsetNextTab;
    pIVar21->Offset = fVar23;
    tab_bar->OffsetNextTab = pIVar21->Width + (pIVar17->Style).ItemInnerSpacing.x + fVar23;
  }
  if (((uVar16 & 2) != 0) && (tab_bar->SelectedTabId != id)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    bVar22 = true;
  }
  else {
    bVar22 = false;
    if (((tab_bar->SelectedTabId == 0) && (bVar22 = false, docked_window == (ImGuiWindow *)0x0)) &&
       (iVar13 < iVar19)) {
      if ((tab_bar->Tabs).Size == 1) {
        bVar22 = (uVar15 & 2) == 0;
      }
      else {
        bVar22 = false;
      }
    }
  }
  if ((iVar18 < iVar19) && (bVar8 || iVar19 <= iVar13)) {
    PushItemFlag(0x18,true);
    goto LAB_001943b7;
  }
  if (tab_bar->SelectedTabId == id) {
    pIVar21->LastFrameSelected = pIVar17->FrameCount;
  }
  local_58._0_4_ = (this->DC).CursorPos.x;
  local_58._4_4_ = (this->DC).CursorPos.y;
  local_a8.Max.x = pIVar21->Width;
  IVar5 = (tab_bar->BarRect).Min;
  IVar29.x = (float)(int)(pIVar21->Offset - tab_bar->ScrollingAnim) + IVar5.x;
  IVar29.y = IVar5.y + 0.0;
  (this->DC).CursorPos = IVar29;
  local_a8.Max.x = local_a8.Max.x + IVar29.x;
  local_a8.Max.y = local_a8.Max.y + IVar29.y;
  fVar23 = (tab_bar->BarRect).Min.x;
  fVar1 = (tab_bar->BarRect).Max.x;
  uVar15 = -(uint)(IVar29.x < fVar23 || fVar1 < local_a8.Max.x);
  local_80 = (ImGuiTabBar *)CONCAT44(local_80._4_4_,uVar15);
  local_60 = iVar18;
  local_5c = iVar19;
  local_a8.Min.x = IVar29.x;
  local_a8.Min.y = IVar29.y;
  if ((uVar15 & 1) != 0) {
    local_68.y = IVar29.y + -1.0;
    local_68.x = (float)(~-(uint)(fVar23 <= IVar29.x) & (uint)fVar23 |
                        -(uint)(fVar23 <= IVar29.x) & (uint)IVar29.x);
    local_8c.x = fVar1;
    local_8c.y = local_a8.Max.y;
    PushClipRect(&local_68,&local_8c,true);
  }
  IVar5 = (this->DC).CursorMaxPos;
  local_68.y = local_a8.Max.y - local_a8.Min.y;
  local_68.x = local_a8.Max.x - local_a8.Min.x;
  ItemSize(&local_68,(pIVar17->Style).FramePadding.y);
  (this->DC).CursorMaxPos = IVar5;
  bVar8 = ItemAdd(&local_a8,id,(ImRect *)0x0);
  if (!bVar8) {
    if (((ulong)local_80 & 1) != 0) {
      PopClipRect();
    }
    (this->DC).CursorPos.x = (float)local_58._0_4_;
    (this->DC).CursorPos.y = (float)local_58._4_4_;
    return bVar22;
  }
  uVar15 = 0x44;
  if (pIVar17->DragDropActive == true) {
    if ((pIVar17->DragDropPayload).DataFrameCount == -1) {
      uVar15 = 0x1044;
    }
    else {
      iVar13 = strcmp("_IMWINDOW",(pIVar17->DragDropPayload).DataType);
      uVar15 = (uint)(iVar13 != 0) << 0xc | 0x44;
    }
  }
  bVar8 = ButtonBehavior(&local_a8,id,(bool *)&local_68,(bool *)&local_8c,uVar15);
  if (bVar8) {
    tab_bar->NextSelectedTabId = id;
  }
  local_68.x._0_1_ = local_68.x._0_1_ | pIVar17->HoveredId == id;
  if (local_8c.x._0_1_ == '\0') {
    SetItemAllowOverlap();
  }
  iVar19 = local_5c;
  iVar13 = local_60;
  if (((docked_window != (ImGuiWindow *)0x0) &&
      (pIVar4 = docked_window->DockNode, pIVar4 != (ImGuiDockNode *)0x0)) &&
     ((pIVar4->ParentNode == (ImGuiDockNode *)0x0 &&
      (((((pIVar4->LocalFlags & 0x400U) == 0 && (local_8c.x._0_1_ == '\x01')) &&
        ((pIVar4->Windows).Size == 1)) && (bVar8 = IsMouseDragging(0,0.0), bVar8)))))) {
    StartMouseMovingWindow(docked_window);
    goto LAB_00194868;
  }
  if (((local_8c.x._0_1_ != '\x01') || (iVar13 < iVar19)) ||
     (bVar8 = IsMouseDragging(0,-1.0), !bVar8)) goto LAB_00194868;
  bVar8 = pIVar17->DragDropActive;
  fVar23 = 0.0;
  if (bVar8 == false) {
    if (docked_window == (ImGuiWindow *)0x0 && (tab_bar->Flags & 1U) == 0) goto LAB_00194868;
    fVar1 = (pIVar17->IO).MouseDelta.x;
    if ((0.0 <= fVar1) || (fVar2 = (pIVar17->IO).MousePos.x, local_a8.Min.x <= fVar2)) {
      if ((fVar1 <= 0.0) || (fVar1 = (pIVar17->IO).MousePos.x, fVar1 <= local_a8.Max.x))
      goto LAB_0019467f;
      fVar23 = fVar1 - local_a8.Max.x;
      IVar14 = '\x01';
    }
    else {
      fVar23 = local_a8.Min.x - fVar2;
      IVar14 = -1;
    }
    if ((tab_bar->Flags & 1U) != 0) {
      tab_bar->ReorderRequestTabId = pIVar21->ID;
      tab_bar->ReorderRequestDir = IVar14;
    }
  }
LAB_0019467f:
  if ((docked_window == (ImGuiWindow *)0x0) || ((docked_window->Flags & 4) != 0)) goto LAB_00194868;
  if ((bVar8 == false) || ((pIVar17->DragDropPayload).SourceId != id)) {
    fVar1 = pIVar17->FontSize;
    fVar26 = (ABS((pIVar17->IO).MouseDragMaxDistanceAbs[0].x) - (fVar1 + fVar1)) * 0.2;
    fVar2 = fVar1 * 4.0;
    if (fVar26 <= fVar1 * 4.0) {
      fVar2 = fVar26;
    }
    fVar28 = (pIVar17->IO).MousePos.y;
    fVar27 = local_a8.Min.y - fVar28;
    fVar28 = fVar28 - local_a8.Max.y;
    uVar15 = -(uint)(fVar28 <= fVar27);
    if ((float)(~uVar15 & (uint)fVar28 | (uint)fVar27 & uVar15) <
        fVar1 * 1.5 + (float)(~-(uint)(fVar26 < 0.0) & (uint)fVar2)) {
      if (fVar23 <= fVar1 * 2.2) goto LAB_00194868;
      if (tab_bar->ReorderRequestDir < '\0') {
        if ((int)((ulong)((long)pIVar21 - (long)(tab_bar->Tabs).Data) >> 3) * -0x33333333 != 0)
        goto LAB_00194868;
      }
      else if ((tab_bar->ReorderRequestDir == '\0') ||
              ((tab_bar->Tabs).Size + -1 !=
               (int)((ulong)((long)pIVar21 - (long)(tab_bar->Tabs).Data) >> 3) * -0x33333333))
      goto LAB_00194868;
    }
  }
  DockContextQueueUndockWindow(pIVar17,docked_window);
  pIVar17->MovingWindow = docked_window;
  pIVar17->ActiveId = docked_window->MoveId;
  IVar5.y = (pIVar17->ActiveIdClickOffset).y - ((docked_window->Pos).y - local_a8.Min.y);
  IVar5.x = (pIVar17->ActiveIdClickOffset).x - ((docked_window->Pos).x - local_a8.Min.x);
  pIVar17->ActiveIdClickOffset = IVar5;
LAB_00194868:
  draw_list = this->DrawList;
  idx = 0x22;
  if ((local_8c.x._0_1_ == '\0') && (local_68.x._0_1_ == '\0')) {
    if (bVar22 == false) {
      idx = (uint)((local_84 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_84 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&local_a8,uVar16,col);
  RenderNavHighlight(&local_a8,id,1);
  bVar8 = IsItemHovered(8);
  if ((bVar8) && ((bVar8 = IsMouseClicked(1,false), bVar8 || (bVar8 = IsMouseReleased(1), bVar8))))
  {
    tab_bar->NextSelectedTabId = id;
  }
  uVar16 = (uint)tab_bar->Flags >> 1 & 4 | uVar16;
  if (local_40 == (bool *)0x0) {
    TabItemLabelAndCloseButton(draw_list,&local_a8,uVar16,tab_bar->FramePadding,local_78,id,0);
  }
  else {
    close_button_id = ImGuiWindow::GetID(this,(void *)((ulong)id + 1));
    bVar8 = TabItemLabelAndCloseButton
                      (draw_list,&local_a8,uVar16,tab_bar->FramePadding,local_78,id,close_button_id)
    ;
    if (bVar8) {
      *local_40 = false;
      if (tab_bar->VisibleTabId == pIVar21->ID) {
        if ((pIVar21->Flags & 1U) == 0) {
          pIVar21->LastFrameVisible = -1;
          tab_bar->SelectedTabId = 0;
          tab_bar->NextSelectedTabId = 0;
        }
      }
      else if ((pIVar21->Flags & 1U) != 0) {
        tab_bar->NextSelectedTabId = pIVar21->ID;
      }
    }
  }
  pIVar17 = local_70;
  if (((ulong)local_80 & 1) != 0) {
    PopClipRect();
  }
  auVar7 = _local_58;
  (this->DC).CursorPos.x = (float)local_58._0_4_;
  (this->DC).CursorPos.y = (float)local_58._4_4_;
  if (pIVar17->HoveredId != id) {
    return bVar22;
  }
  if (local_8c.x._0_1_ != '\0') {
    return bVar22;
  }
  if (pIVar17->HoveredIdNotActiveTimer <= 0.5) {
    return bVar22;
  }
  _local_58 = auVar7;
  bVar8 = IsItemHovered(0);
  pcVar6 = local_78;
  if (!bVar8) {
    return bVar22;
  }
  if ((tab_bar->Flags & 0x20) != 0) {
    return bVar22;
  }
  pcVar12 = FindRenderedTextEnd(local_78,(char *)0x0);
  SetTooltip("%.*s",(ulong)(uint)((int)pcVar12 - (int)pcVar6),pcVar6);
  return bVar22;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags, ImGuiWindow* docked_window)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;
    tab->Window = docked_window;

    // Append name with zero-terminator
    if (tab_bar->Flags & ImGuiTabBarFlags_DockNode)
    {
        IM_ASSERT(tab->Window != NULL);
        tab->NameOffset = -1;
    }
    else
    {
        IM_ASSERT(tab->Window == NULL);
        tab->NameOffset = tab_bar->TabsNames.size();
        tab_bar->TabsNames.append(label, label + strlen(label) + 1); // Append name _with_ the zero-terminator.
    }

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Lock visibility
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing && docked_window == NULL)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    if (tab_appearing && !(tab_bar_appearing && !tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x > tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive && !g.DragDropPayload.IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW))
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop a single floating window node moves it
    ImGuiDockNode* node = docked_window ? docked_window->DockNode : NULL;
    const bool single_floating_window_node = node && node->IsFloatingNode() && (node->Windows.Size == 1);
    if (held && single_floating_window_node && IsMouseDragging(0, 0.0f))
    {
        // Move
        StartMouseMovingWindow(docked_window);
    }
    else if (held && !tab_appearing && IsMouseDragging(0))
    {
        // Drag and drop: re-order tabs
        float drag_distance_from_edge_x = 0.0f;
        if (!g.DragDropActive && ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (docked_window != NULL)))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                drag_distance_from_edge_x = bb.Min.x - g.IO.MousePos.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                drag_distance_from_edge_x = g.IO.MousePos.x - bb.Max.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }

        // Extract a Dockable window out of it's tab bar
        if (docked_window != NULL && !(docked_window->Flags & ImGuiWindowFlags_NoMove))
        {
            // We use a variable threshold to distinguish dragging tabs within a tab bar and extracting them out of the tab bar
            bool undocking_tab = (g.DragDropActive && g.DragDropPayload.SourceId == id);

            if (!undocking_tab) //&& (!g.IO.ConfigDockingWithShift || g.IO.KeyShift)
            {
                float threshold_base = g.FontSize;
                //float threshold_base = g.IO.ConfigDockingWithShift ? g.FontSize * 0.5f : g.FontSize;
                float threshold_x = (threshold_base * 2.2f);
                float threshold_y = (threshold_base * 1.5f) + ImClamp((ImFabs(g.IO.MouseDragMaxDistanceAbs[0].x) - threshold_base * 2.0f) * 0.20f, 0.0f, threshold_base * 4.0f);
                //GetForegroundDrawList()->AddRect(ImVec2(bb.Min.x - threshold_x, bb.Min.y - threshold_y), ImVec2(bb.Max.x + threshold_x, bb.Max.y + threshold_y), IM_COL32_WHITE); // [DEBUG]

                float distance_from_edge_y = ImMax(bb.Min.y - g.IO.MousePos.y, g.IO.MousePos.y - bb.Max.y);
                if (distance_from_edge_y >= threshold_y)
                    undocking_tab = true;
                else if (drag_distance_from_edge_x > threshold_x)
                    if ((tab_bar->ReorderRequestDir < 0 && tab_bar->GetTabOrder(tab) == 0) || (tab_bar->ReorderRequestDir > 0 && tab_bar->GetTabOrder(tab) == tab_bar->Tabs.Size - 1))
                        undocking_tab = true;
            }

            if (undocking_tab)
            {
                // Undock
                DockContextQueueUndockWindow(&g, docked_window);
                g.MovingWindow = docked_window;
                g.ActiveId = g.MovingWindow->MoveId;
                g.ActiveIdClickOffset -= g.MovingWindow->Pos - bb.Min;
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}